

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void CalcResizePosSizeFromAnyCorner
               (ImGuiWindow *window,ImVec2 *corner_target,ImVec2 *corner_norm,ImVec2 *out_pos,
               ImVec2 *out_size)

{
  ImVec2 IVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  
  IVar1 = ImLerp(corner_target,&window->Pos,corner_norm);
  fVar2 = IVar1.x;
  fVar3 = IVar1.y;
  fVar4 = (window->Size).x + (window->Pos).x;
  fVar5 = (window->Size).y + (window->Pos).y;
  fVar4 = ((*corner_norm).x * ((*corner_target).x - fVar4) + fVar4) - fVar2;
  fVar5 = ((*corner_norm).y * ((*corner_target).y - fVar5) + fVar5) - fVar3;
  IVar1.y = fVar5;
  IVar1.x = fVar4;
  IVar1 = CalcWindowSizeAfterConstraint(window,IVar1);
  out_pos->x = fVar2;
  out_pos->y = fVar3;
  if ((corner_norm->x == 0.0) && (!NAN(corner_norm->x))) {
    out_pos->x = fVar2 - (IVar1.x - fVar4);
  }
  if ((corner_norm->y == 0.0) && (!NAN(corner_norm->y))) {
    out_pos->y = fVar3 - (IVar1.y - fVar5);
  }
  *out_size = IVar1;
  return;
}

Assistant:

static void CalcResizePosSizeFromAnyCorner(ImGuiWindow* window, const ImVec2& corner_target, const ImVec2& corner_norm, ImVec2* out_pos, ImVec2* out_size)
{
    ImVec2 pos_min = ImLerp(corner_target, window->Pos, corner_norm);                // Expected window upper-left
    ImVec2 pos_max = ImLerp(window->Pos + window->Size, corner_target, corner_norm); // Expected window lower-right
    ImVec2 size_expected = pos_max - pos_min;
    ImVec2 size_constrained = CalcWindowSizeAfterConstraint(window, size_expected);
    *out_pos = pos_min;
    if (corner_norm.x == 0.0f)
        out_pos->x -= (size_constrained.x - size_expected.x);
    if (corner_norm.y == 0.0f)
        out_pos->y -= (size_constrained.y - size_expected.y);
    *out_size = size_constrained;
}